

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * __thiscall CTape::produce(string *__return_storage_ptr__,CTape *this,string *phrase)

{
  size_type sVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  string local_50;
  
  paVar2 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (phrase->_M_string_length == 0) {
    sVar1 = 0;
  }
  else {
    uVar3 = 0;
    do {
      produce_letter_abi_cxx11_(&local_50,this,(phrase->_M_dataplus)._M_p[uVar3]);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < phrase->_M_string_length);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->_M_dataplus)._M_p;
    sVar1 = __return_storage_ptr__->_M_string_length;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,paVar2,sVar1 + (long)paVar2);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string produce(const std::string& phrase)
        {
            std::string result;
            for (std::string::size_type i = 0; i < phrase.size(); ++i)
            {
                result += produce_letter(phrase[i]);
            }
            result = optimize(result);
            return result;
        }